

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_reader.cpp
# Opt level: O3

void __thiscall diffusion::Tokenizer::~Tokenizer(Tokenizer *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  std::
  deque<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~deque(&this->processed_data_queue_);
  pcVar1 = (this->unprocessed_data_)._M_dataplus._M_p;
  paVar2 = &(this->unprocessed_data_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

void push(std::string const & raw_data) {
        unprocessed_data_ += raw_data;
        auto message_length = *reinterpret_cast<Size *>(&unprocessed_data_[0]);
        unprocessed_data_.erase(0, sizeof(Size));
        if (message_length < 0)
            throw ErrorDataCorruption();
        if (static_cast<std::size_t>(message_length) > unprocessed_data_.size()) {
        } else {
            std::lock_guard<std::mutex> lock(queue_mutex_);
            processed_data_queue_.push_back(to_vector_char(&unprocessed_data_[0], message_length));
            unprocessed_data_.erase(0, message_length);
        }
    }